

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

bool __thiscall Operand::operator==(Operand *this,Operand *other)

{
  __type_conflict local_19;
  Operand *other_local;
  Operand *this_local;
  
  local_19 = false;
  if ((this->type == other->type) && (local_19 = false, this->reg_num == other->reg_num)) {
    local_19 = std::operator==(&this->value,&other->value);
  }
  return local_19;
}

Assistant:

bool operator==(const Operand& other) const {
		return type == other.type && reg_num == other.reg_num && value == other.value;
	}